

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O0

FT_ULong FT_Stream_ReadULongLE(FT_Stream stream,FT_Error *error)

{
  unsigned_long uVar1;
  FT_Stream local_38;
  FT_ULong result;
  FT_Byte *p;
  FT_Error *pFStack_20;
  FT_Byte reads [4];
  FT_Error *error_local;
  FT_Stream stream_local;
  
  local_38 = (FT_Stream)0x0;
  *error = 0;
  pFStack_20 = error;
  if (stream->pos + 3 < stream->size) {
    if (stream->read == (FT_Stream_IoFunc)0x0) {
      result = (FT_ULong)(stream->base + stream->pos);
    }
    else {
      uVar1 = (*stream->read)(stream,stream->pos,(uchar *)((long)&p + 4),4);
      if (uVar1 != 4) goto LAB_0014b401;
      result = (long)&p + 4;
    }
    if (result != 0) {
      local_38 = (FT_Stream)
                 (ulong)((uint)*(byte *)(result + 3) << 0x18 | (uint)*(byte *)(result + 2) << 0x10 |
                         (uint)*(byte *)(result + 1) << 8 | (uint)*(byte *)result);
    }
    stream->pos = stream->pos + 4;
    stream_local = local_38;
  }
  else {
LAB_0014b401:
    *pFStack_20 = 0x55;
    stream_local = (FT_Stream)0x0;
  }
  return (FT_ULong)stream_local;
}

Assistant:

FT_BASE_DEF( FT_ULong )
  FT_Stream_ReadULongLE( FT_Stream  stream,
                         FT_Error*  error )
  {
    FT_Byte   reads[4];
    FT_Byte*  p      = 0;
    FT_ULong  result = 0;


    FT_ASSERT( stream );

    *error = FT_Err_Ok;

    if ( stream->pos + 3 < stream->size )
    {
      if ( stream->read )
      {
        if ( stream->read( stream, stream->pos, reads, 4L ) != 4L )
          goto Fail;

        p = reads;
      }
      else
        p = stream->base + stream->pos;

      if ( p )
        result = FT_NEXT_ULONG_LE( p );
    }
    else
      goto Fail;

    stream->pos += 4;

    return result;

  Fail:
    *error = FT_THROW( Invalid_Stream_Operation );
    FT_ERROR(( "FT_Stream_ReadULongLE:"
               " invalid i/o; pos = 0x%lx, size = 0x%lx\n",
               stream->pos, stream->size ));

    return 0;
  }